

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afcjk.c
# Opt level: O0

void af_cjk_hints_link_segments(AF_GlyphHints hints,AF_Dimension dim)

{
  AF_Direction AVar1;
  uint uVar2;
  AF_Segment_conflict pAVar3;
  AF_Segment pAVar4;
  AF_Segment pAVar5;
  AF_Segment_conflict pAVar6;
  AF_AxisHintsRec *pAVar7;
  FT_Long FVar8;
  long lVar9;
  long lVar10;
  FT_Long local_a8;
  AF_Segment_conflict local_a0;
  AF_Segment_conflict link;
  AF_Segment_conflict seg;
  AF_Segment_conflict link2;
  AF_Segment_conflict link1;
  FT_Pos len;
  FT_Pos max;
  FT_Pos min;
  FT_Pos dist;
  FT_Pos dist_threshold;
  FT_Pos len_threshold;
  AF_Segment_conflict seg2;
  AF_Segment_conflict seg1;
  AF_Direction major_dir;
  AF_Segment_conflict segment_limit;
  AF_Segment_conflict segments;
  AF_AxisHints axis;
  AF_Dimension dim_local;
  AF_GlyphHints hints_local;
  
  pAVar7 = hints->axis + dim;
  pAVar3 = pAVar7->segments;
  if (pAVar3 == (AF_Segment_conflict)0x0) {
    local_a0 = (AF_Segment_conflict)0x0;
  }
  else {
    local_a0 = pAVar3 + pAVar7->num_segments;
  }
  AVar1 = pAVar7->major_dir;
  uVar2 = *(uint *)&hints->metrics[1].style_class;
  if (dim == AF_DIMENSION_HORZ) {
    local_a8 = hints->x_scale;
  }
  else {
    local_a8 = hints->y_scale;
  }
  FVar8 = FT_DivFix(0xc0,local_a8);
  for (seg2 = pAVar3; pAVar6 = pAVar3, seg2 < local_a0; seg2 = seg2 + 1) {
    len_threshold = (FT_Pos)pAVar3;
    if (seg2->dir == AVar1) {
      for (; (ulong)len_threshold < local_a0; len_threshold = len_threshold + 0x50) {
        if ((((AF_Segment_conflict)len_threshold != seg2) &&
            ((int)seg2->dir + (int)*(char *)(len_threshold + 1) == 0)) &&
           (lVar9 = (long)((int)*(short *)(len_threshold + 2) - (int)seg2->pos), -1 < lVar9)) {
          max = (FT_Pos)seg2->min_coord;
          len = (FT_Pos)seg2->max_coord;
          if (max < *(short *)(len_threshold + 6)) {
            max = (FT_Pos)*(short *)(len_threshold + 6);
          }
          if (*(short *)(len_threshold + 8) < len) {
            len = (FT_Pos)*(short *)(len_threshold + 8);
          }
          lVar10 = len - max;
          if ((long)(((ulong)uVar2 << 3) / 0x800) <= lVar10) {
            if ((SBORROW8(lVar9 * 8,seg2->score * 9) != lVar9 * 8 + seg2->score * -9 < 0) &&
               ((SBORROW8(lVar9 * 8,seg2->score * 7) != lVar9 * 8 + seg2->score * -7 < 0 ||
                (seg2->len < lVar10)))) {
              seg2->score = lVar9;
              seg2->len = lVar10;
              seg2->link = (AF_Segment)len_threshold;
            }
            if ((SBORROW8(lVar9 * 8,*(long *)(len_threshold + 0x30) * 9) !=
                 lVar9 * 8 + *(long *)(len_threshold + 0x30) * -9 < 0) &&
               ((SBORROW8(lVar9 * 8,*(long *)(len_threshold + 0x30) * 7) !=
                 lVar9 * 8 + *(long *)(len_threshold + 0x30) * -7 < 0 ||
                (*(long *)(len_threshold + 0x38) < lVar10)))) {
              *(long *)(len_threshold + 0x30) = lVar9;
              *(long *)(len_threshold + 0x38) = lVar10;
              *(AF_Segment_conflict *)(len_threshold + 0x20) = seg2;
            }
          }
        }
      }
    }
  }
  do {
    seg2 = pAVar6;
    if (local_a0 <= seg2) {
      while (seg2 = pAVar3, seg2 < local_a0) {
        pAVar4 = seg2->link;
        if (((pAVar4 != (AF_Segment)0x0) && (pAVar4->link != seg2)) &&
           ((seg2->link = (AF_Segment)0x0, pAVar4->score < FVar8 ||
            (seg2->score < pAVar4->score * 4)))) {
          seg2->serif = pAVar4->link;
        }
        pAVar3 = seg2 + 1;
      }
      return;
    }
    pAVar4 = seg2->link;
    if ((((pAVar4 != (AF_Segment)0x0) && (pAVar4->link == seg2)) && (seg2->pos < pAVar4->pos)) &&
       (len_threshold = (FT_Pos)pAVar3, seg2->score < FVar8)) {
      for (; (ulong)len_threshold < local_a0; len_threshold = len_threshold + 0x50) {
        if ((((*(short *)(len_threshold + 2) <= seg2->pos) &&
             (seg2 != (AF_Segment_conflict)len_threshold)) &&
            ((pAVar5 = *(AF_Segment *)(len_threshold + 0x20), pAVar5 != (AF_Segment)0x0 &&
             ((pAVar5->link == (AF_Segment)len_threshold && (pAVar4->pos <= pAVar5->pos)))))) &&
           (((seg2->pos != *(short *)(len_threshold + 2) || (pAVar4->pos != pAVar5->pos)) &&
            ((seg2->score < *(long *)(len_threshold + 0x30) &&
             (*(long *)(len_threshold + 0x30) < seg2->score * 4)))))) {
          link = pAVar3;
          if (SBORROW8(seg2->len,*(long *)(len_threshold + 0x38) * 3) !=
              seg2->len + *(long *)(len_threshold + 0x38) * -3 < 0) {
            pAVar4->link = (AF_Segment)0x0;
            seg2->link = (AF_Segment)0x0;
            break;
          }
          for (; link < local_a0; link = link + 1) {
            if (link->link == (AF_Segment)len_threshold) {
              link->link = (AF_Segment)0x0;
              link->serif = pAVar4;
            }
            else if (link->link == pAVar5) {
              link->link = (AF_Segment)0x0;
              link->serif = seg2;
            }
          }
        }
      }
    }
    pAVar6 = seg2 + 1;
  } while( true );
}

Assistant:

static void
  af_cjk_hints_link_segments( AF_GlyphHints  hints,
                              AF_Dimension   dim )
  {
    AF_AxisHints  axis          = &hints->axis[dim];
    AF_Segment    segments      = axis->segments;
    AF_Segment    segment_limit = FT_OFFSET( segments, axis->num_segments );
    AF_Direction  major_dir     = axis->major_dir;
    AF_Segment    seg1, seg2;
    FT_Pos        len_threshold;
    FT_Pos        dist_threshold;


    len_threshold = AF_LATIN_CONSTANT( hints->metrics, 8 );

    dist_threshold = ( dim == AF_DIMENSION_HORZ ) ? hints->x_scale
                                                  : hints->y_scale;
    dist_threshold = FT_DivFix( 64 * 3, dist_threshold );

    /* now compare each segment to the others */
    for ( seg1 = segments; seg1 < segment_limit; seg1++ )
    {
      if ( seg1->dir != major_dir )
        continue;

      for ( seg2 = segments; seg2 < segment_limit; seg2++ )
        if ( seg2 != seg1 && seg1->dir + seg2->dir == 0 )
        {
          FT_Pos  dist = seg2->pos - seg1->pos;


          if ( dist < 0 )
            continue;

          {
            FT_Pos  min = seg1->min_coord;
            FT_Pos  max = seg1->max_coord;
            FT_Pos  len;


            if ( min < seg2->min_coord )
              min = seg2->min_coord;

            if ( max > seg2->max_coord )
              max = seg2->max_coord;

            len = max - min;
            if ( len >= len_threshold )
            {
              if ( dist * 8 < seg1->score * 9                        &&
                   ( dist * 8 < seg1->score * 7 || seg1->len < len ) )
              {
                seg1->score = dist;
                seg1->len   = len;
                seg1->link  = seg2;
              }

              if ( dist * 8 < seg2->score * 9                        &&
                   ( dist * 8 < seg2->score * 7 || seg2->len < len ) )
              {
                seg2->score = dist;
                seg2->len   = len;
                seg2->link  = seg1;
              }
            }
          }
        }
    }

    /*
     * now compute the `serif' segments
     *
     * In Hanzi, some strokes are wider on one or both of the ends.
     * We either identify the stems on the ends as serifs or remove
     * the linkage, depending on the length of the stems.
     *
     */

    {
      AF_Segment  link1, link2;


      for ( seg1 = segments; seg1 < segment_limit; seg1++ )
      {
        link1 = seg1->link;
        if ( !link1 || link1->link != seg1 || link1->pos <= seg1->pos )
          continue;

        if ( seg1->score >= dist_threshold )
          continue;

        for ( seg2 = segments; seg2 < segment_limit; seg2++ )
        {
          if ( seg2->pos > seg1->pos || seg1 == seg2 )
            continue;

          link2 = seg2->link;
          if ( !link2 || link2->link != seg2 || link2->pos < link1->pos )
            continue;

          if ( seg1->pos == seg2->pos && link1->pos == link2->pos )
            continue;

          if ( seg2->score <= seg1->score || seg1->score * 4 <= seg2->score )
            continue;

          /* seg2 < seg1 < link1 < link2 */

          if ( seg1->len >= seg2->len * 3 )
          {
            AF_Segment  seg;


            for ( seg = segments; seg < segment_limit; seg++ )
            {
              AF_Segment  link = seg->link;


              if ( link == seg2 )
              {
                seg->link  = NULL;
                seg->serif = link1;
              }
              else if ( link == link2 )
              {
                seg->link  = NULL;
                seg->serif = seg1;
              }
            }
          }
          else
          {
            seg1->link = link1->link = NULL;

            break;
          }
        }
      }
    }

    for ( seg1 = segments; seg1 < segment_limit; seg1++ )
    {
      seg2 = seg1->link;

      if ( seg2 )
      {
        if ( seg2->link != seg1 )
        {
          seg1->link = NULL;

          if ( seg2->score < dist_threshold || seg1->score < seg2->score * 4 )
            seg1->serif = seg2->link;
        }
      }
    }
  }